

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

void * Abc_NtkAttrFree(Abc_Ntk_t *pNtk,int Attr,int fFreeMan)

{
  void **ppvVar1;
  int *__ptr;
  int iVar2;
  long lVar3;
  void *pvVar4;
  
  if ((-1 < Attr) && (Attr < pNtk->vAttrs->nSize)) {
    ppvVar1 = pNtk->vAttrs->pArray;
    __ptr = (int *)ppvVar1[(uint)Attr];
    ppvVar1[(uint)Attr] = (void *)0x0;
    if (__ptr == (int *)0x0) {
      pvVar4 = (void *)0x0;
    }
    else {
      if (*(long *)(__ptr + 10) != 0) {
        iVar2 = *__ptr;
        if (0 < iVar2) {
          lVar3 = 0;
          do {
            if (*(long *)(*(long *)(__ptr + 2) + lVar3 * 8) != 0) {
              (**(code **)(__ptr + 10))(*(undefined8 *)(__ptr + 4));
              iVar2 = *__ptr;
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 < iVar2);
        }
      }
      pvVar4 = *(void **)(__ptr + 4);
      if (fFreeMan != 0) {
        if (pvVar4 != (void *)0x0) {
          (**(code **)(__ptr + 6))(pvVar4);
        }
        pvVar4 = (void *)0x0;
      }
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
      }
      free(__ptr);
    }
    return pvVar4;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Frees one attribute manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void * Abc_NtkAttrFree( Abc_Ntk_t * pNtk, int Attr, int fFreeMan ) 
{  
    void * pUserMan;
    Vec_Att_t * pAttrMan;
    pAttrMan = (Vec_Att_t *)Vec_PtrEntry( pNtk->vAttrs, Attr );
    Vec_PtrWriteEntry( pNtk->vAttrs, Attr, NULL );
    pUserMan = Vec_AttFree( pAttrMan, fFreeMan );
    return pUserMan;
}